

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLContextState.cpp
# Opt level: O0

void __thiscall Diligent::GLContextState::BindFBO(GLContextState *this,GLFrameBufferObj *FBO)

{
  bool bVar1;
  Char *pCVar2;
  undefined1 local_70 [8];
  string msg_1;
  GLenum err_1;
  undefined1 local_40 [8];
  string msg;
  GLenum err;
  GLuint FBOHandle;
  GLFrameBufferObj *FBO_local;
  GLContextState *this_local;
  
  msg.field_2._12_4_ = 0;
  bVar1 = UpdateBoundObject<GLObjectWrappers::GLFrameBufferObj>
                    (&this->m_FBOId,FBO,(GLuint *)(msg.field_2._M_local_buf + 0xc));
  if (bVar1) {
    (*__glewBindFramebuffer)(0x8ca9,msg.field_2._12_4_);
    msg.field_2._8_4_ = glGetError();
    if (msg.field_2._8_4_ != 0) {
      LogError<false,char[39],char[17],unsigned_int>
                (false,"BindFBO",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
                 ,0xc1,(char (*) [39])"Failed to bind FBO as draw framebuffer",
                 (char (*) [17])"\nGL Error Code: ",(uint *)(msg.field_2._M_local_buf + 8));
      FormatString<char[6]>((string *)local_40,(char (*) [6])0x4585f6);
      pCVar2 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar2,"BindFBO",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
                 ,0xc1);
      std::__cxx11::string::~string((string *)local_40);
    }
    (*__glewBindFramebuffer)(0x8ca8,msg.field_2._12_4_);
    msg_1.field_2._8_4_ = glGetError();
    if (msg_1.field_2._8_4_ != 0) {
      LogError<false,char[39],char[17],unsigned_int>
                (false,"BindFBO",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
                 ,0xc3,(char (*) [39])"Failed to bind FBO as read framebuffer",
                 (char (*) [17])"\nGL Error Code: ",(uint *)(msg_1.field_2._M_local_buf + 8));
      FormatString<char[6]>((string *)local_70,(char (*) [6])0x4585f6);
      pCVar2 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar2,"BindFBO",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
                 ,0xc3);
      std::__cxx11::string::~string((string *)local_70);
    }
  }
  return;
}

Assistant:

void GLContextState::BindFBO(const GLFrameBufferObj& FBO)
{
    GLuint FBOHandle = 0;
    if (UpdateBoundObject(m_FBOId, FBO, FBOHandle))
    {
        // Even though the write mask only applies to writes to a framebuffer, the mask state is NOT
        // Framebuffer state. So it is NOT part of a Framebuffer Object or the Default Framebuffer.
        // Binding a new framebuffer will NOT affect the mask.

        // NOTE: if attachment image is a NON-immutable format texture and the selected
        // level is NOT level_base, the texture MUST BE MIPMAP COMPLETE
        // If image is part of a cubemap texture, the texture must also be mipmap cube complete.
        glBindFramebuffer(GL_DRAW_FRAMEBUFFER, FBOHandle);
        DEV_CHECK_GL_ERROR("Failed to bind FBO as draw framebuffer");
        glBindFramebuffer(GL_READ_FRAMEBUFFER, FBOHandle);
        DEV_CHECK_GL_ERROR("Failed to bind FBO as read framebuffer");
    }
}